

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slider.cpp
# Opt level: O1

void __thiscall gui::Slider::handleMousePress(Slider *this,Button button,Vector2f *mouseParent)

{
  float fVar1;
  Vector2f VVar2;
  Transform *this_00;
  Vector2f *pVVar3;
  float local_28;
  
  Widget::handleMousePress(&this->super_Widget,button,mouseParent);
  this_00 = Widget::getInverseTransform(&this->super_Widget);
  VVar2 = sf::Transform::transformPoint(this_00,mouseParent);
  pVVar3 = Widget::getOrigin(&this->super_Widget);
  if ((button == Left) && (this->isDragging_ == false)) {
    local_28 = VVar2.x;
    fVar1 = pVVar3->x;
    pVVar3 = Widget::getOrigin(&this->super_Widget);
    updateThumb(this,(local_28 - fVar1) + pVVar3->x);
    this->isDragging_ = true;
    Widget::requestRedraw(&this->super_Widget);
    return;
  }
  return;
}

Assistant:

void Slider::handleMousePress(sf::Mouse::Button button, const sf::Vector2f& mouseParent) {
    baseClass::handleMousePress(button, mouseParent);
    const auto mouseLocal = toLocalOriginSpace(mouseParent);
    if (button == sf::Mouse::Left && !isDragging_) {
        updateThumb(mouseLocal.x + getOrigin().x);
        isDragging_ = true;
        requestRedraw();
    }
}